

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall indk::Position::setPosition(Position *this,Position *P)

{
  uint uVar1;
  Error *this_00;
  float fVar2;
  uint local_28;
  uint i;
  Position *P_local;
  Position *this_local;
  
  uVar1 = getDimensionsCount(P);
  if (uVar1 < this->DimensionsCount) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  for (local_28 = 0; local_28 < this->DimensionsCount; local_28 = local_28 + 1) {
    fVar2 = getPositionValue(P,local_28);
    this->X[local_28] = fVar2;
  }
  return;
}

Assistant:

void indk::Position::setPosition(const indk::Position &P) {
    if (P.getDimensionsCount() < DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}